

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmain.cpp
# Opt level: O0

void __thiscall CTcMain::CTcMain(CTcMain *this,CResLoader *res_loader,char *default_charset)

{
  char *pcVar1;
  CTcTokenizer *pCVar2;
  CTcPrsMem *pCVar3;
  CTcParser *pCVar4;
  CTcDataStream *pCVar5;
  CTcCodeStream *pCVar6;
  CTcGenTarg *pCVar7;
  long in_RDX;
  undefined8 in_RSI;
  EVP_PKEY_CTX *ctx;
  undefined4 *in_RDI;
  char mapname [32];
  char csbuf [4096];
  char *in_stack_ffffffffffffef30;
  undefined8 in_stack_ffffffffffffef38;
  char stream_id;
  CTcCodeStream *in_stack_ffffffffffffef40;
  undefined8 in_stack_ffffffffffffef48;
  CTcDataStream *pCVar8;
  char cVar9;
  CTcParser *in_stack_ffffffffffffef50;
  CTcGenTarg *this_00;
  char *in_stack_ffffffffffffeff0;
  CResLoader *in_stack_ffffffffffffeff8;
  char *in_stack_fffffffffffff050;
  CResLoader *in_stack_fffffffffffff058;
  CTcTokenizer *in_stack_fffffffffffff060;
  
  cVar9 = (char)((ulong)in_stack_ffffffffffffef48 >> 0x38);
  if (in_RDX == 0) {
    os_get_charmap((char *)in_stack_ffffffffffffef40,(int)((ulong)in_stack_ffffffffffffef38 >> 0x20)
                  );
  }
  if (console_mapper_ == (CCharmapToLocal *)0x0) {
    os_get_charmap((char *)in_stack_ffffffffffffef40,(int)((ulong)in_stack_ffffffffffffef38 >> 0x20)
                  );
    console_mapper_ = CCharmapToLocal::load(in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0);
    if (console_mapper_ == (CCharmapToLocal *)0x0) {
      console_mapper_ = CCharmapToLocal::load(in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0);
    }
  }
  stream_id = (char)((ulong)in_stack_ffffffffffffef38 >> 0x38);
  *(undefined8 *)(in_RDI + 0xc) = in_RSI;
  *(undefined8 *)(in_RDI + 6) = 4;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 10) = 0;
  pcVar1 = lib_copy_str(in_stack_ffffffffffffef30);
  *(char **)(in_RDI + 0xe) = pcVar1;
  pCVar2 = (CTcTokenizer *)operator_new(0xd70);
  CTcTokenizer::CTcTokenizer
            (in_stack_fffffffffffff060,in_stack_fffffffffffff058,in_stack_fffffffffffff050);
  G_tok = pCVar2;
  pCVar3 = (CTcPrsMem *)operator_new(0x20);
  CTcPrsMem::CTcPrsMem((CTcPrsMem *)0x24da5e);
  G_prsmem = pCVar3;
  pCVar4 = (CTcParser *)operator_new(0x268);
  CTcParser::CTcParser(in_stack_ffffffffffffef50);
  G_prs = pCVar4;
  pCVar5 = (CTcDataStream *)operator_new(0x68);
  CTcDataStream::CTcDataStream((CTcDataStream *)in_stack_ffffffffffffef50,cVar9);
  G_ds = pCVar5;
  pCVar6 = (CTcCodeStream *)operator_new(0xf0);
  CTcCodeStream::CTcCodeStream(in_stack_ffffffffffffef40,stream_id);
  G_cs_main = pCVar6;
  pCVar6 = (CTcCodeStream *)operator_new(0xf0);
  CTcCodeStream::CTcCodeStream(in_stack_ffffffffffffef40,stream_id);
  G_cs = G_cs_main;
  G_cs_static = pCVar6;
  pCVar5 = (CTcDataStream *)operator_new(0x68);
  CTcDataStream::CTcDataStream((CTcDataStream *)in_stack_ffffffffffffef50,cVar9);
  G_os = pCVar5;
  pCVar5 = (CTcDataStream *)operator_new(0x68);
  CTcDataStream::CTcDataStream((CTcDataStream *)in_stack_ffffffffffffef50,cVar9);
  G_icmod_stream = pCVar5;
  pCVar5 = (CTcDataStream *)operator_new(0x68);
  CTcDataStream::CTcDataStream((CTcDataStream *)in_stack_ffffffffffffef50,cVar9);
  G_dict_stream = pCVar5;
  pCVar5 = (CTcDataStream *)operator_new(0x68);
  CTcDataStream::CTcDataStream((CTcDataStream *)in_stack_ffffffffffffef50,cVar9);
  G_gramprod_stream = pCVar5;
  pCVar5 = (CTcDataStream *)operator_new(0x68);
  CTcDataStream::CTcDataStream((CTcDataStream *)in_stack_ffffffffffffef50,cVar9);
  G_bignum_stream = pCVar5;
  pCVar7 = (CTcGenTarg *)operator_new(0x68);
  CTcDataStream::CTcDataStream((CTcDataStream *)pCVar7,cVar9);
  G_rexpat_stream = (CTcDataStream *)pCVar7;
  this_00 = (CTcGenTarg *)G_rexpat_stream;
  pCVar5 = (CTcDataStream *)operator_new(0x68);
  CTcDataStream::CTcDataStream((CTcDataStream *)this_00,(char)((ulong)pCVar5 >> 0x38));
  G_int_class_stream = pCVar5;
  pCVar8 = G_int_class_stream;
  pCVar5 = (CTcDataStream *)operator_new(0x68);
  cVar9 = (char)((ulong)pCVar8 >> 0x38);
  CTcDataStream::CTcDataStream((CTcDataStream *)this_00,cVar9);
  G_static_init_id_stream = pCVar5;
  pCVar5 = (CTcDataStream *)operator_new(0x68);
  ctx = (EVP_PKEY_CTX *)0xb;
  CTcDataStream::CTcDataStream((CTcDataStream *)this_00,cVar9);
  G_lcl_stream = pCVar5;
  pCVar7 = (CTcGenTarg *)operator_new(0x100);
  CTcGenTarg::CTcGenTarg(this_00);
  G_cg = pCVar7;
  CTcParser::init(G_prs,ctx);
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 100;
  G_disasm_out = (CTcUnasOut *)0x0;
  return;
}

Assistant:

CTcMain::CTcMain(CResLoader *res_loader, const char *default_charset)
{
    char csbuf[OSFNMAX];
    
    /* 
     *   if the caller didn't provide a default character set, ask the OS
     *   what we should use
     */
    if (default_charset == 0)
    {
        /* 
         *   ask the OS what to use for file contents, since we use this
         *   character set to translate the text we read from source files 
         */
        os_get_charmap(csbuf, OS_CHARMAP_FILECONTENTS);
        
        /* use our OS-provided character set */
        default_charset = csbuf;
    }

    /* if there's no static console output character map, create one */
    if (console_mapper_ == 0)
    {
        char mapname[32];

        /* get the console character set name */
        os_get_charmap(mapname, OS_CHARMAP_DISPLAY);

        /* create a resource loader for the console character map */
        console_mapper_ = CCharmapToLocal::load(res_loader, mapname);

        /* if that failed, create an ASCII mapper */
        if (console_mapper_ == 0)
            console_mapper_ = CCharmapToLocal::load(res_loader, "us-ascii");
    }
    
    /* remember our resource loader */
    res_loader_ = res_loader;
    
    /* 
     *   set default options - minimum verbosity, no numeric error codes,
     *   show standard warnings but not pedantic warnings, not test mode 
     */
    err_options_ = TCMAIN_ERR_WARNINGS;

    /* we have no warning suppression list yet */
    suppress_list_ = 0;
    suppress_cnt_ = 0;

    /* remember our default character set */
    default_charset_ = lib_copy_str(default_charset);

    /* create the tokenizer */
    G_tok = new CTcTokenizer(res_loader_, default_charset_);
    
    /* 
     *   Create the parser and node memory pool.  Create the memory pool
     *   first, because the parser allocates objects out of the pool. 
     */
    G_prsmem = new CTcPrsMem();
    G_prs = new CTcParser();

    /* create the generator data stream (for constant data) */
    G_ds = new CTcDataStream(TCGEN_DATA_STREAM);

    /* create the primary generator code stream */
    G_cs_main = new CTcCodeStream(TCGEN_CODE_STREAM);

    /* create the static initializer code stream */
    G_cs_static = new CTcCodeStream(TCGEN_STATIC_CODE_STREAM);

    /* make the primary code stream active */
    G_cs = G_cs_main;

    /* create the generator object data stream */
    G_os = new CTcDataStream(TCGEN_OBJECT_STREAM);

    /* create the intrinsic class modifier object data stream */
    G_icmod_stream = new CTcDataStream(TCGEN_ICMOD_STREAM);

    /* create the dictionary object data stream */
    G_dict_stream = new CTcDataStream(TCGEN_DICT_STREAM);

    /* create the grammar-production object data stream */
    G_gramprod_stream = new CTcDataStream(TCGEN_GRAMPROD_STREAM);

    /* create the BigNumber object data stream */
    G_bignum_stream = new CTcDataStream(TCGEN_BIGNUM_STREAM);

    /* create the RexPattern object data stream */
    G_rexpat_stream = new CTcDataStream(TCGEN_REXPAT_STREAM);

    /* create the IntrinsicClass object data stream */
    G_int_class_stream = new CTcDataStream(TCGEN_INTCLASS_STREAM);

    /* create the static initializer identifier stream */
    G_static_init_id_stream = new CTcDataStream(TCGEN_STATIC_INIT_ID_STREAM);

    /* create the local variable name stream */
    G_lcl_stream = new CTcDataStream(TCGEN_LCL_VAR_STREAM);

    /* create the target-specific code generator */
    G_cg = new CTcGenTarg();

    /* initialize the parser */
    G_prs->init();

    /* no errors or warnings yet */
    error_count_ = 0;
    warning_count_ = 0;
    first_error_ = 0;
    first_warning_ = 0;

    /* set a fairly liberal maximum error limit */
    max_error_count_ = 100;

    /* there's no disassembly output stream yet */
    G_disasm_out = 0;
}